

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSnprintfElementContent(void)

{
  int iVar1;
  int iVar2;
  int val;
  char *val_00;
  xmlElementContentPtr val_01;
  int local_3c;
  int n_englob;
  int englob;
  int n_content;
  xmlElementContentPtr content;
  int n_size;
  int size;
  int n_buf;
  char *buf;
  int mem_base;
  int test_ret;
  
  buf._4_4_ = 0;
  for (n_size = 0; n_size < 1; n_size = n_size + 1) {
    for (content._4_4_ = 0; (int)content._4_4_ < 4; content._4_4_ = content._4_4_ + 1) {
      for (n_englob = 0; n_englob < 1; n_englob = n_englob + 1) {
        for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
          iVar1 = xmlMemBlocks();
          val_00 = gen_char_ptr(n_size,0);
          iVar2 = gen_int(content._4_4_,1);
          val_01 = gen_xmlElementContentPtr(n_englob,2);
          val = gen_int(local_3c,3);
          xmlSnprintfElementContent(val_00,iVar2,val_01,val);
          call_tests = call_tests + 1;
          des_char_ptr(n_size,val_00,0);
          des_int(content._4_4_,iVar2,1);
          des_xmlElementContentPtr(n_englob,val_01,2);
          des_int(local_3c,val,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSnprintfElementContent",
                   (ulong)(uint)(iVar2 - iVar1));
            buf._4_4_ = buf._4_4_ + 1;
            printf(" %d",(ulong)(uint)n_size);
            printf(" %d",(ulong)content._4_4_);
            printf(" %d",(ulong)(uint)n_englob);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return buf._4_4_;
}

Assistant:

static int
test_xmlSnprintfElementContent(void) {
    int test_ret = 0;

    int mem_base;
    char * buf; /* an output buffer */
    int n_buf;
    int size; /* the buffer size */
    int n_size;
    xmlElementContentPtr content; /* An element table */
    int n_content;
    int englob; /* 1 if one must print the englobing parenthesis, 0 otherwise */
    int n_englob;

    for (n_buf = 0;n_buf < gen_nb_char_ptr;n_buf++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
    for (n_content = 0;n_content < gen_nb_xmlElementContentPtr;n_content++) {
    for (n_englob = 0;n_englob < gen_nb_int;n_englob++) {
        mem_base = xmlMemBlocks();
        buf = gen_char_ptr(n_buf, 0);
        size = gen_int(n_size, 1);
        content = gen_xmlElementContentPtr(n_content, 2);
        englob = gen_int(n_englob, 3);

        xmlSnprintfElementContent(buf, size, content, englob);
        call_tests++;
        des_char_ptr(n_buf, buf, 0);
        des_int(n_size, size, 1);
        des_xmlElementContentPtr(n_content, content, 2);
        des_int(n_englob, englob, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSnprintfElementContent",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_buf);
            printf(" %d", n_size);
            printf(" %d", n_content);
            printf(" %d", n_englob);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}